

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O2

int __thiscall llvm::APInt::abs(APInt *this,int __x)

{
  bool bVar1;
  undefined4 in_register_00000034;
  APInt *this_00;
  APInt AStack_28;
  
  this_00 = (APInt *)CONCAT44(in_register_00000034,__x);
  bVar1 = isNegative(this_00);
  if (bVar1) {
    APInt(&AStack_28,this_00);
    operator-((llvm *)this,&AStack_28);
    ~APInt(&AStack_28);
  }
  else {
    APInt(this,this_00);
  }
  return (int)this;
}

Assistant:

APInt abs() const {
    if (isNegative())
      return -(*this);
    return *this;
  }